

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::createDefinition
          (Compilation *this,Scope *scope,LookupLocation location,ModuleDeclarationSyntax *syntax)

{
  RootSymbol *pRVar1;
  _Head_base<0UL,_slang::ast::Definition_*,_false> _Var2;
  Definition *pDVar3;
  PrimitiveSymbol *pPVar4;
  __single_object _Var5;
  DefinitionMetadata *pDVar6;
  iterator iVar7;
  Diagnostic *pDVar8;
  __uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_> *this_00;
  pair<const_slang::ast::Definition_*,_bool> *ppVar9;
  iterator iVar10;
  Scope *pSVar11;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var12;
  __single_object def;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> key;
  LookupLocation location_local;
  
  location_local.scope = location.scope;
  location_local.index = location.index;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)syntax;
  pDVar6 = ska::
           flat_hash_map<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>
           ::operator[](&this->definitionMetadata,(ModuleDeclarationSyntax **)&key);
  std::
  make_unique<slang::ast::Definition,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ModuleDeclarationSyntax_const&,slang::ast::NetType_const&,slang::ast::UnconnectedDrive&,std::optional<slang::TimeScale>&,slang::syntax::SyntaxTree_const*&>
            ((Scope *)&def,(LookupLocation *)scope,(ModuleDeclarationSyntax *)&location_local,
             (NetType *)syntax,(UnconnectedDrive *)pDVar6->defaultNetType,
             (optional<slang::TimeScale> *)&pDVar6->unconnectedDrive,
             (SyntaxTree **)&pDVar6->timeScale);
  pRVar1 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  _Var12._M_head_impl = &pRVar1->super_Scope;
  if (pRVar1 == (RootSymbol *)0x0) {
    _Var12._M_head_impl = (Scope *)0x0;
  }
  if (scope->thisSym->kind != CompilationUnit) {
    _Var12._M_head_impl = scope;
  }
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = *(size_t *)
            def._M_t.
            super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
            .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = *(char **)((long)def._M_t.
                            super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                            .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl + 8
                     );
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)_Var12._M_head_impl;
  iVar7 = ska::detailv3::
          sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
          ::find(&(this->definitionMap).
                  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                 ,&key);
  _Var5 = def;
  if ((iVar7.current !=
       (this->definitionMap).
       super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
       .entries +
       (this->definitionMap).
       super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
       .num_slots_minus_one +
       (long)(this->definitionMap).
             super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
             .max_lookups) &&
     (*(long *)def._M_t.
               super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
               .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl != 0)) {
    _Var2._M_head_impl =
         ((iVar7.current)->field_1).value.second._M_t.
         super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
         .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
    pDVar8 = Scope::addDiag(scope,(DiagCode)0x3a000a,
                            *(SourceLocation *)
                             ((long)def._M_t.
                                    super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                                    .super__Head_base<0UL,_slang::ast::Definition_*,_false>.
                                    _M_head_impl + 0x10));
    Diagnostic::operator<<
              (pDVar8,*(string_view *)
                       _Var5._M_t.
                       super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                       .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl);
    Diagnostic::addNote(pDVar8,(DiagCode)0x80001,(_Var2._M_head_impl)->location);
  }
  this_00 = (__uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_> *
            )ska::
             flat_hash_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>
             ::operator[](&this->definitionMap,&key);
  _Var5 = def;
  def._M_t.
  super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>.
  super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl =
       (__uniq_ptr_data<slang::ast::Definition,_std::default_delete<slang::ast::Definition>,_true,_true>
        )(__uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>)0x0;
  std::__uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>::reset
            (this_00,(pointer)_Var5._M_t.
                              super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                              .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl);
  pRVar1 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  pSVar11 = &pRVar1->super_Scope;
  if (pRVar1 == (RootSymbol *)0x0) {
    pSVar11 = (Scope *)0x0;
  }
  if (_Var12._M_head_impl == pSVar11) {
    pDVar3 = (this_00->_M_t).
             super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
             .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
    ppVar9 = ska::
             flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>
             ::operator[](&this->topDefinitions,&pDVar3->name);
    ppVar9->first = pDVar3;
    iVar10 = ska::detailv3::
             sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
             ::find(&(this->udpMap).
                     super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
                    ,&((this_00->_M_t).
                       super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                       .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl)->name);
    if ((iVar10.current !=
         (this->udpMap).
         super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
         .entries +
         (this->udpMap).
         super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
         .num_slots_minus_one +
         (long)(this->udpMap).
               super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
               .max_lookups) &&
       (pDVar3 = (this_00->_M_t).
                 super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                 .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl,
       (pDVar3->name)._M_len != 0)) {
      pPVar4 = ((iVar10.current)->field_1).value.second;
      pDVar8 = Scope::addDiag(scope,(DiagCode)0x24000a,
                              *(SourceLocation *)&(pDVar3->location).field_0x0);
      Diagnostic::operator<<(pDVar8,pDVar3->name);
      Diagnostic::addNote(pDVar8,(DiagCode)0x80001,(pPVar4->super_Symbol).location);
    }
  }
  else {
    ppVar9 = ska::
             flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>
             ::operator[](&this->topDefinitions,
                          &((this_00->_M_t).
                            super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                            .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl)->
                           name);
    ppVar9->second = true;
  }
  std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>::~unique_ptr
            (&def);
  return;
}

Assistant:

void Compilation::createDefinition(const Scope& scope, LookupLocation location,
                                   const ModuleDeclarationSyntax& syntax) {
    auto& metadata = definitionMetadata[&syntax];
    auto def = std::make_unique<Definition>(scope, location, syntax, *metadata.defaultNetType,
                                            metadata.unconnectedDrive, metadata.timeScale,
                                            metadata.tree);

    // Record that the given scope contains this definition. If the scope is a compilation unit, add
    // it to the root scope instead so that lookups from other compilation units will find it.
    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    std::tuple key(def->name, targetScope);
    if (auto it = definitionMap.find(key); it != definitionMap.end())
        reportRedefinition(scope, *def, *it->second, diag::DuplicateDefinition);

    const auto& result = (definitionMap[key] = std::move(def));
    if (targetScope == root.get()) {
        topDefinitions[result->name].first = result.get();
        if (auto primIt = udpMap.find(result->name); primIt != udpMap.end())
            reportRedefinition(scope, *result, *primIt->second);
    }
    else {
        // Record the fact that we have nested modules with this given name.
        topDefinitions[result->name].second = true;
    }
}